

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

int Rsb_DecInitCexes(int nVars,word *f,word **g,int nGs,int nGsAll,word *pCexes,Vec_Int_t *vTries)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int iCexF1;
  int iCexF0;
  int iCexT1;
  int iCexT0;
  int ValueE;
  int ValueB;
  int nWords;
  word *pCexes_local;
  int nGsAll_local;
  int nGs_local;
  word **g_local;
  word *f_local;
  int nVars_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  iVar2 = Abc_TtGetBit(f,0);
  iVar3 = Abc_TtGetBit(f,iVar1 * 0x40 + -1);
  if (iVar2 == 0) {
    local_50 = Abc_TtFindFirstBit(f,nVars);
  }
  else {
    local_50 = 0;
  }
  if (iVar3 == 0) {
    local_54 = Abc_TtFindLastBit(f,nVars);
  }
  else {
    local_54 = iVar1 * 0x40 + -1;
  }
  if (iVar2 == 0) {
    local_58 = 0;
  }
  else {
    local_58 = Abc_TtFindFirstZero(f,nVars);
  }
  if (iVar3 == 0) {
    local_5c = iVar1 * 0x40 + -1;
  }
  else {
    local_5c = Abc_TtFindLastZero(f,nVars);
  }
  iVar1 = Rsb_DecTryCex(f,local_50,local_58);
  if (iVar1 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x131,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar1 = Rsb_DecTryCex(f,local_50,local_5c);
  if (iVar1 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF1 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x132,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar1 = Rsb_DecTryCex(f,local_54,local_58);
  if (iVar1 == 0) {
    iVar1 = Rsb_DecTryCex(f,local_54,local_5c);
    if (iVar1 == 0) {
      Rsb_DecRecordCex(g,nGsAll,local_50,local_58,pCexes,0);
      Rsb_DecRecordCex(g,nGsAll,local_50,local_5c,pCexes,1);
      Rsb_DecRecordCex(g,nGsAll,local_54,local_58,pCexes,2);
      Rsb_DecRecordCex(g,nGsAll,local_54,local_5c,pCexes,3);
      if (vTries != (Vec_Int_t *)0x0) {
        Vec_IntPush(vTries,-1);
        Vec_IntPush(vTries,-1);
        Vec_IntPush(vTries,-1);
        Vec_IntPush(vTries,-1);
      }
      return 4;
    }
    __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF1 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x134,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF0 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                ,0x133,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)");
}

Assistant:

int Rsb_DecInitCexes( int nVars, word * f, word ** g, int nGs, int nGsAll, word * pCexes, Vec_Int_t * vTries ) 
{
    int nWords = Abc_TtWordNum( nVars );
    int ValueB = Abc_TtGetBit( f, 0 );
    int ValueE = Abc_TtGetBit( f, 64*nWords-1 );
    int iCexT0, iCexT1, iCexF0, iCexF1;

    iCexT0 = ValueB  ? 0           : Abc_TtFindFirstBit( f, nVars );
    iCexT1 = ValueE  ? 64*nWords-1 : Abc_TtFindLastBit( f, nVars );

    iCexF0 = !ValueB ? 0           : Abc_TtFindFirstZero( f, nVars );
    iCexF1 = !ValueE ? 64*nWords-1 : Abc_TtFindLastZero( f, nVars );

    assert( !Rsb_DecTryCex( f, iCexT0, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT0, iCexF1 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF1 ) );

    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF0, pCexes, 0 );
    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF1, pCexes, 1 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF0, pCexes, 2 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF1, pCexes, 3 );

    if ( vTries )
    {
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    }
    return 4;
}